

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_gencmn.cpp
# Opt level: O0

char * allocString(uint32_t length)

{
  ulong uVar1;
  char *p;
  uint32_t top;
  uint32_t length_local;
  
  if (200000 < stringTop + length) {
    fprintf(_stderr,"gencmn: out of memory\n");
    exit(7);
  }
  uVar1 = (ulong)stringTop;
  stringTop = stringTop + length;
  return stringStore + uVar1;
}

Assistant:

static char *
allocString(uint32_t length) {
    uint32_t top=stringTop+length;
    char *p;

    if(top>STRING_STORE_SIZE) {
        fprintf(stderr, "gencmn: out of memory\n");
        exit(U_MEMORY_ALLOCATION_ERROR);
    }
    p=stringStore+stringTop;
    stringTop=top;
    return p;
}